

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O2

Move<vk::Handle<(vk::HandleType)9>_> *
vkt::pipeline::anon_unknown_0::makeImage
          (Move<vk::Handle<(vk::HandleType)9>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkImageCreateFlags flags,VkImageType imageType,VkFormat format,IVec3 *size
          ,deUint32 numMipLevels,deUint32 numLayers,VkImageUsageFlags usage)

{
  VkImageCreateInfo local_68;
  
  local_68.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.extent.width = size->m_data[0];
  local_68.extent.height = size->m_data[1];
  local_68.extent.depth = size->m_data[2];
  local_68.mipLevels = numMipLevels;
  local_68.arrayLayers = numLayers;
  local_68.samples = VK_SAMPLE_COUNT_1_BIT;
  local_68.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_68.usage = usage;
  local_68.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_68.queueFamilyIndexCount = 0;
  local_68.pQueueFamilyIndices = (deUint32 *)0x0;
  local_68.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_68.flags = flags;
  local_68.imageType = imageType;
  local_68.format = format;
  ::vk::createImage(__return_storage_ptr__,vk,device,&local_68,(VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkImage> makeImage (const DeviceInterface&		vk,
						 const VkDevice				device,
						 VkImageCreateFlags			flags,
						 VkImageType				imageType,
						 const VkFormat				format,
						 const IVec3&				size,
						 const deUint32				numMipLevels,
						 const deUint32				numLayers,
						 const VkImageUsageFlags	usage)
{
	const VkImageCreateInfo imageParams =
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,	// VkStructureType			sType;
		DE_NULL,								// const void*				pNext;
		flags,									// VkImageCreateFlags		flags;
		imageType,								// VkImageType				imageType;
		format,									// VkFormat					format;
		makeExtent3D(size),						// VkExtent3D				extent;
		numMipLevels,							// deUint32					mipLevels;
		numLayers,								// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,					// VkSampleCountFlagBits	samples;
		VK_IMAGE_TILING_OPTIMAL,				// VkImageTiling			tiling;
		usage,									// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,				// VkSharingMode			sharingMode;
		0u,										// deUint32					queueFamilyIndexCount;
		DE_NULL,								// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED,				// VkImageLayout			initialLayout;
	};
	return createImage(vk, device, &imageParams);
}